

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdAddPsbtTxOutWithPubkey
              (void *handle,void *psbt_handle,int64_t amount,char *locking_script,char *descriptor,
              uint32_t *index)

{
  Psbt *this;
  Psbt *this_00;
  bool bVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  undefined1 local_828 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_args;
  Script script;
  string err_msg;
  DescriptorScriptReference ref;
  Descriptor desc;
  KeyData key;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ref,"PsbtHandle",(allocator *)&err_msg);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&ref);
  std::__cxx11::string::~string((string *)&ref);
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    ref._0_8_ = (long)
                "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                + 0x56;
    ref.locking_script_._vptr_Script._0_4_ = 0x4fc;
    ref.locking_script_.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdAddPsbtTxOutWithPubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"psbt is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ref,"Failed to handle statement. psbt is null.",(allocator *)&err_msg);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&ref);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Script::Script(&script);
  bVar1 = cfd::capi::IsEmptyString(locking_script);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&err_msg,locking_script,(allocator *)&desc);
    cfd::core::Script::Script((Script *)&ref,&err_msg);
    cfd::core::Script::operator=(&script,(Script *)&ref);
    cfd::core::Script::~Script((Script *)&ref);
    std::__cxx11::string::~string((string *)&err_msg);
  }
  bVar1 = cfd::capi::IsEmptyString(descriptor);
  if (bVar1) {
    bVar1 = cfd::core::Script::IsEmpty(&script);
    if (bVar1) {
      ref._0_8_ = (long)
                  "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                  + 0x56;
      ref.locking_script_._vptr_Script._0_4_ = 0x51a;
      ref.locking_script_.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "CfdAddPsbtTxOutWithPubkey";
      cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"locking_script is null or empty.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ref,"Failed to parameter. locking_script is null or empty.",
                 (allocator *)&err_msg);
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ref);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    this = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::Amount::Amount((Amount *)&ref,amount);
    uVar2 = cfd::core::Psbt::AddTxOut(this,&script,(Amount *)&ref);
  }
  else {
    std::__cxx11::string::string((string *)&ref,descriptor,(allocator *)&err_msg);
    cfd::core::Descriptor::Parse
              (&desc,(string *)&ref,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    std::__cxx11::string::~string((string *)&ref);
    path_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    path_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    path_args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Descriptor::GetKeyData(&key,&desc,&path_args);
    cfd::core::Descriptor::GetReference(&ref,&desc,&path_args);
    bVar1 = cfd::core::Script::IsEmpty(&script);
    if (!bVar1) {
      cfd::core::DescriptorScriptReference::GetLockingScript((Script *)&err_msg,&ref);
      bVar1 = cfd::core::Script::Equals(&script,(Script *)&err_msg);
      cfd::core::Script::~Script((Script *)&err_msg);
      if (!bVar1) {
        std::__cxx11::string::string
                  ((string *)&err_msg,"locking_script doesn\'t match the descriptor.",
                   (allocator *)local_828);
        local_828._0_8_ = "cfdcapi_psbt.cpp";
        local_828._8_4_ = 0x50f;
        local_828._16_8_ = "CfdAddPsbtTxOutWithPubkey";
        cfd::core::logger::warn<std::__cxx11::string&>((CfdSourceLocation *)local_828,"{}",&err_msg)
        ;
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_828,"Failed to parameter. ",&err_msg);
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_828);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
    }
    this_00 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::Amount::Amount((Amount *)local_828,amount);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)&err_msg,&ref,*(NetType *)((long)psbt_handle + 0x10));
    uVar2 = cfd::Psbt::AddTxOutData(this_00,(Amount *)local_828,(Address *)&err_msg,&key);
    cfd::core::Address::~Address((Address *)&err_msg);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&ref);
    cfd::core::KeyData::~KeyData(&key);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&path_args);
    cfd::core::DescriptorNode::~DescriptorNode(&desc.root_node_);
  }
  if (index != (uint32_t *)0x0) {
    *index = uVar2;
  }
  cfd::core::Script::~Script(&script);
  return 0;
}

Assistant:

int CfdAddPsbtTxOutWithPubkey(
    void* handle, void* psbt_handle, int64_t amount,
    const char* locking_script, const char* descriptor, uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script;
    uint32_t txout_index = 0;
    if (!IsEmptyString(locking_script)) {
      script = Script(locking_script);
    }

    if (!IsEmptyString(descriptor)) {
      Descriptor desc = Descriptor::Parse(descriptor);
      std::vector<std::string> path_args;
      auto key = desc.GetKeyData(path_args);
      auto ref = desc.GetReference(&path_args);
      if ((!script.IsEmpty()) && (!script.Equals(ref.GetLockingScript()))) {
        std::string err_msg = "locking_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }

      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), ref.GenerateAddress(psbt_obj->net_type), key);
    } else if (!script.IsEmpty()) {
      txout_index = psbt_obj->psbt->AddTxOut(script, Amount(amount));
    } else {
      warn(CFD_LOG_SOURCE, "locking_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking_script is null or empty.");
    }

    if (index != nullptr) *index = txout_index;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}